

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

uint32 __thiscall Protocol::MQTT::V5::WillMessage::copyInto(WillMessage *this,uint8 *buffer)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  PropertyBase *pPVar6;
  
  memcpy(buffer,&(this->willProperties).length.field_0,(ulong)(this->willProperties).length.size);
  uVar5 = (ulong)(this->willProperties).length.size;
  for (pPVar6 = (this->willProperties).head; iVar4 = (int)uVar5, pPVar6 != (PropertyBase *)0x0;
      pPVar6 = pPVar6->next) {
    iVar3 = (*(pPVar6->super_Serializable)._vptr_Serializable[1])(pPVar6,buffer + uVar5);
    uVar5 = (ulong)(uint)(iVar4 + iVar3);
  }
  uVar1 = (this->willTopic).length;
  if (BigEndian(unsigned_short)::signature != '\x01') {
    if (BigEndian(unsigned_short)::signature == '\x04') {
      uVar1 = uVar1 << 8 | uVar1 >> 8;
    }
    else {
      uVar1 = 0;
    }
  }
  *(ushort *)(buffer + uVar5) = uVar1;
  memcpy((ushort *)((long)(buffer + uVar5) + 2),(this->willTopic).data,
         (ulong)(this->willTopic).length);
  uVar1 = (this->willTopic).length;
  uVar2 = (this->willPayload).length;
  if (BigEndian(unsigned_short)::signature != '\x01') {
    if (BigEndian(unsigned_short)::signature == '\x04') {
      uVar2 = uVar2 << 8 | uVar2 >> 8;
    }
    else {
      uVar2 = 0;
    }
  }
  *(ushort *)(buffer + (ulong)((uint)uVar1 + iVar4 + 2) + 2 + -2) = uVar2;
  memcpy(buffer + (ulong)((uint)uVar1 + iVar4 + 2) + 2,(this->willPayload).data,
         (ulong)(this->willPayload).length);
  return (uint)(this->willPayload).length + iVar4 + (uint)uVar1 + 4;
}

Assistant:

virtual uint32 copyInto(uint8 * buffer) const
                {
                    uint32 o = willProperties.copyInto(buffer);
                    o += willTopic.copyInto(buffer+o);
                    o += willPayload.copyInto(buffer+o);
                    return o;
                }